

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::copyNextWord(ObjFileParser *this,char *pBuffer,size_t length)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  pbVar5 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar1 = pbVar3 + -1;
  if (pbVar1 != pbVar5 && pbVar5 != pbVar3) {
    do {
      if (((*pbVar5 != 0x20) && (*pbVar5 != 9)) || (pbVar5 = pbVar5 + 1, pbVar5 == pbVar3)) break;
    } while (pbVar5 != pbVar1);
  }
  (this->m_DataIt)._M_current = (char *)pbVar5;
  if (*pbVar5 == 0x5c) {
    pbVar5 = pbVar5 + 2;
    (this->m_DataIt)._M_current = (char *)pbVar5;
    if (pbVar1 != pbVar5 && pbVar5 != pbVar3) {
      while ((*pbVar5 == 0x20 || (*pbVar5 == 9))) {
        pbVar5 = pbVar5 + 1;
        if ((pbVar5 == pbVar3) || (pbVar5 == pbVar1)) break;
      }
    }
    (this->m_DataIt)._M_current = (char *)pbVar5;
  }
  if (pbVar5 == pbVar3) {
    uVar6 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      bVar2 = *pbVar5;
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
      goto LAB_0049a02a;
      pBuffer[uVar6] = bVar2;
      if (length - 2 == uVar6) break;
      pbVar5 = (byte *)((this->m_DataIt)._M_current + 1);
      (this->m_DataIt)._M_current = (char *)pbVar5;
      uVar4 = uVar6 + 1;
    } while (pbVar5 != (byte *)(this->m_DataItEnd)._M_current);
    uVar6 = uVar6 + 1;
  }
LAB_0049a02a:
  if (uVar6 < length) {
    pBuffer[uVar6] = '\0';
    return;
  }
  __assert_fail("index < length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileParser.cpp"
                ,0x104,"void Assimp::ObjFileParser::copyNextWord(char *, size_t)");
}

Assistant:

void ObjFileParser::copyNextWord(char *pBuffer, size_t length) {
    size_t index = 0;
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if ( *m_DataIt == '\\' ) {
        ++m_DataIt;
        ++m_DataIt;
        m_DataIt = getNextWord<DataArrayIt>( m_DataIt, m_DataItEnd );
    }
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        pBuffer[index] = *m_DataIt;
        index++;
        if( index == length - 1 ) {
            break;
        }
        ++m_DataIt;
    }

    ai_assert(index < length);
    pBuffer[index] = '\0';
}